

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::resize
          (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
           *this,double target_density,bool force_retrain,bool keep_left,bool keep_right)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  double dVar4;
  unsigned_long *__s;
  int *piVar5;
  int *piVar6;
  long lVar7;
  size_type __n;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int i;
  int iVar13;
  int iVar14;
  ulong __n_00;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar22 [16];
  undefined8 in_XMM3_Qb;
  const_iterator_type it;
  const_iterator_type it_1;
  
  iVar14 = this->num_keys_;
  if (iVar14 == 0) {
    return;
  }
  iVar2 = iVar14 + 1;
  if (iVar14 + 1 <= (int)((double)iVar14 / target_density)) {
    iVar2 = (int)((double)iVar14 / target_density);
  }
  iVar13 = 0;
  dVar15 = (double)iVar2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar15 * 0.015625;
  auVar17 = vroundsd_avx(auVar17,auVar17,10);
  __n_00 = vcvttsd2usi_avx512f(auVar17);
  __s = __gnu_cxx::new_allocator<unsigned_long>::allocate
                  ((new_allocator<unsigned_long> *)&it,__n_00,(void *)0x0);
  memset(__s,0,-(ulong)(__n_00 >> 0x3d != 0) | __n_00 * 8);
  __n = (size_type)iVar2;
  piVar5 = __gnu_cxx::new_allocator<int>::allocate((new_allocator<int> *)&it,__n,(void *)0x0);
  piVar6 = __gnu_cxx::new_allocator<int>::allocate((new_allocator<int> *)&it,__n,(void *)0x0);
  iVar14 = this->num_keys_;
  if (iVar14 < 0x32 || force_retrain) {
    Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
    ::Iterator(&it_1,this,0);
    it.node_ = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                *)&(this->super_AlexNode<int,_int>).model_;
    it.cur_idx_ = 0;
    unique0x00076c00 = (longdouble)0;
    while (((long)it_1.cur_idx_ != -1 && (it_1.cur_idx_ < this->data_capacity_))) {
      LinearModelBuilder<int>::add
                ((LinearModelBuilder<int> *)&it,(it_1.node_)->key_slots_[it_1.cur_idx_],iVar13);
      Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
      ::operator++(&it_1,0);
      iVar13 = iVar13 + 1;
    }
    LinearModelBuilder<int>::build((LinearModelBuilder<int> *)&it);
    if (!keep_left) {
      if (!keep_right) {
        iVar14 = this->num_keys_;
        iVar13 = iVar14;
        goto LAB_00135bdb;
      }
      iVar13 = this->data_capacity_;
      iVar14 = this->num_keys_;
      dVar16 = (double)iVar13 / (double)iVar14;
      (this->super_AlexNode<int,_int>).model_.a_ =
           dVar16 * (this->super_AlexNode<int,_int>).model_.a_;
      dVar16 = dVar16 * (this->super_AlexNode<int,_int>).model_.b_ + (double)(iVar2 - iVar13);
LAB_00135bcb:
      (this->super_AlexNode<int,_int>).model_.b_ = dVar16;
      goto LAB_00135bf3;
    }
    iVar14 = this->num_keys_;
    dVar16 = (double)this->data_capacity_ / (double)iVar14;
  }
  else {
    if (keep_right) {
      dVar16 = (double)(iVar2 - this->data_capacity_) + (this->super_AlexNode<int,_int>).model_.b_;
      goto LAB_00135bcb;
    }
    if (keep_left) goto LAB_00135bf3;
    iVar13 = this->data_capacity_;
LAB_00135bdb:
    dVar16 = dVar15 / (double)iVar13;
  }
  dVar4 = (this->super_AlexNode<int,_int>).model_.b_;
  (this->super_AlexNode<int,_int>).model_.a_ = dVar16 * (this->super_AlexNode<int,_int>).model_.a_;
  (this->super_AlexNode<int,_int>).model_.b_ = dVar16 * dVar4;
LAB_00135bf3:
  Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
  ::Iterator(&it,this,0);
  iVar13 = iVar2 - iVar14;
  uVar12 = 0xffffffffffffffff;
  while( true ) {
    iVar11 = (int)uVar12;
    lVar7 = (long)it.cur_idx_;
    if ((lVar7 == -1) || (this->data_capacity_ <= it.cur_idx_)) goto LAB_00135d29;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = (this->super_AlexNode<int,_int>).model_.a_;
    uVar8 = iVar11 + 1;
    iVar11 = (it.node_)->key_slots_[lVar7];
    auVar18._0_8_ = (double)iVar11;
    auVar18._8_8_ = in_XMM2_Qb;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (this->super_AlexNode<int,_int>).model_.b_;
    auVar17 = vfmadd213sd_fma(auVar18,auVar20,auVar1);
    uVar3 = (int)auVar17._0_8_;
    if ((int)auVar17._0_8_ < (int)uVar8) {
      uVar3 = uVar8;
    }
    uVar12 = (ulong)uVar3;
    uVar9 = (ulong)uVar8;
    if ((int)(iVar2 - uVar3) < iVar14) break;
    uVar10 = (ulong)uVar3;
    for (; uVar9 < uVar10; uVar9 = uVar9 + 1) {
      piVar5[uVar9] = iVar11;
    }
    piVar5[uVar10] = iVar11;
    piVar6[uVar10] = (it.node_)->payload_slots_[lVar7];
    iVar14 = iVar14 + -1;
    __s[uVar3 >> 6] = __s[uVar3 >> 6] | 1L << (uVar12 & 0x3f);
    Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
    ::operator++(&it,0);
    iVar13 = iVar13 + 1;
  }
  for (; (long)uVar9 < (long)(iVar2 - iVar14); uVar9 = uVar9 + 1) {
    piVar5[uVar9] = iVar11;
  }
  for (uVar12 = (ulong)iVar13; (long)uVar12 < (long)__n; uVar12 = uVar12 + 1) {
    piVar5[uVar12] = (it.node_)->key_slots_[it.cur_idx_];
    piVar6[uVar12] = (it.node_)->payload_slots_[it.cur_idx_];
    __s[(int)uVar12 >> 6] = __s[(int)uVar12 >> 6] | 1L << (uVar12 & 0x3f);
    Iterator<const_alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>,_const_int,_const_std::pair<int,_int>_>
    ::operator++(&it,0);
  }
  iVar11 = (int)uVar12 + -1;
LAB_00135d29:
  lVar7 = (long)iVar11;
  while (lVar7 = lVar7 + 1, lVar7 < (long)__n) {
    piVar5[lVar7] = 0x7fffffff;
  }
  operator_delete(this->key_slots_,(long)this->data_capacity_ << 2);
  operator_delete(this->payload_slots_,(long)this->data_capacity_ << 2);
  operator_delete(this->bitmap_,(long)this->bitmap_size_ << 3);
  this->data_capacity_ = iVar2;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar15;
  this->bitmap_size_ = (int)__n_00;
  this->key_slots_ = piVar5;
  this->payload_slots_ = piVar6;
  this->bitmap_ = __s;
  auVar19._0_8_ = (double)(this->num_keys_ + 1);
  auVar19._8_8_ = in_XMM3_Qb;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar15 * 0.8;
  auVar17 = vmaxsd_avx(auVar19,auVar21);
  auVar17 = vminsd_avx(auVar22,auVar17);
  this->expansion_threshold_ = auVar17._0_8_;
  this->contraction_threshold_ = dVar15 * 0.6;
  return;
}

Assistant:

void resize(double target_density, bool force_retrain = false,
              bool keep_left = false, bool keep_right = false) {
    if (num_keys_ == 0) {
      return;
    }

    int new_data_capacity =
        std::max(static_cast<int>(num_keys_ / target_density), num_keys_ + 1);
    auto new_bitmap_size =
        static_cast<size_t>(std::ceil(new_data_capacity / 64.));
    auto new_bitmap = new (bitmap_allocator().allocate(new_bitmap_size))
        uint64_t[new_bitmap_size]();  // initialize to all false
#if ALEX_DATA_NODE_SEP_ARRAYS
    T* new_key_slots =
        new (key_allocator().allocate(new_data_capacity)) T[new_data_capacity];
    P* new_payload_slots = new (payload_allocator().allocate(new_data_capacity))
        P[new_data_capacity];
#else
    V* new_data_slots = new (value_allocator().allocate(new_data_capacity))
        V[new_data_capacity];
#endif

    // Retrain model if the number of keys is sufficiently small (under 50)
    if (num_keys_ < 50 || force_retrain) {
      const_iterator_type it(this, 0);
      LinearModelBuilder<T> builder(&(this->model_));
      for (int i = 0; it.cur_idx_ < data_capacity_ && !it.is_end(); it++, i++) {
        builder.add(it.key(), i);
      }
      builder.build();
      if (keep_left) {
        this->model_.expand(static_cast<double>(data_capacity_) / num_keys_);
      } else if (keep_right) {
        this->model_.expand(static_cast<double>(data_capacity_) / num_keys_);
        this->model_.b_ += (new_data_capacity - data_capacity_);
      } else {
        this->model_.expand(static_cast<double>(new_data_capacity) / num_keys_);
      }
    } else {
      if (keep_right) {
        this->model_.b_ += (new_data_capacity - data_capacity_);
      } else if (!keep_left) {
        this->model_.expand(static_cast<double>(new_data_capacity) /
                            data_capacity_);
      }
    }

    int last_position = -1;
    int keys_remaining = num_keys_;
    const_iterator_type it(this, 0);
    for (; it.cur_idx_ < data_capacity_ && !it.is_end(); it++) {
      int position = this->model_.predict(it.key());
      position = std::max<int>(position, last_position + 1);

      int positions_remaining = new_data_capacity - position;
      if (positions_remaining < keys_remaining) {
        // fill the rest of the store contiguously
        int pos = new_data_capacity - keys_remaining;
        for (int j = last_position + 1; j < pos; j++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
          new_key_slots[j] = it.key();
#else
          new_data_slots[j].first = it.key();
#endif
        }
        for (; pos < new_data_capacity; pos++, it++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
          new_key_slots[pos] = it.key();
          new_payload_slots[pos] = it.payload();
#else
          new_data_slots[pos] = *it;
#endif
          set_bit(new_bitmap, pos);
        }
        last_position = pos - 1;
        break;
      }

      for (int j = last_position + 1; j < position; j++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
        new_key_slots[j] = it.key();
#else
        new_data_slots[j].first = it.key();
#endif
      }

#if ALEX_DATA_NODE_SEP_ARRAYS
      new_key_slots[position] = it.key();
      new_payload_slots[position] = it.payload();
#else
      new_data_slots[position] = *it;
#endif
      set_bit(new_bitmap, position);

      last_position = position;

      keys_remaining--;
    }

    for (int i = last_position + 1; i < new_data_capacity; i++) {
#if ALEX_DATA_NODE_SEP_ARRAYS
      new_key_slots[i] = kEndSentinel_;
#else
      new_data_slots[i].first = kEndSentinel;
#endif
    }

#if ALEX_DATA_NODE_SEP_ARRAYS
    key_allocator().deallocate(key_slots_, data_capacity_);
    payload_allocator().deallocate(payload_slots_, data_capacity_);
#else
    value_allocator().deallocate(data_slots_, data_capacity_);
#endif
    bitmap_allocator().deallocate(bitmap_, bitmap_size_);

    data_capacity_ = new_data_capacity;
    bitmap_size_ = new_bitmap_size;
#if ALEX_DATA_NODE_SEP_ARRAYS
    key_slots_ = new_key_slots;
    payload_slots_ = new_payload_slots;
#else
    data_slots_ = new_data_slots;
#endif
    bitmap_ = new_bitmap;

    expansion_threshold_ =
        std::min(std::max(data_capacity_ * kMaxDensity_,
                          static_cast<double>(num_keys_ + 1)),
                 static_cast<double>(data_capacity_));
    contraction_threshold_ = data_capacity_ * kMinDensity_;
  }